

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O3

void __thiscall
perfetto::TracingServiceImpl::ConsumerEndpointImpl::GetTraceStats(ConsumerEndpointImpl *this)

{
  _Rb_tree_header *p_Var1;
  TraceStats *this_00;
  ulong uVar2;
  TracingServiceImpl *this_01;
  pointer this_02;
  undefined8 uVar3;
  undefined8 *puVar4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  TaskRunner *pTVar7;
  TraceStats stats;
  undefined8 *local_1b8;
  undefined8 uStack_1b0;
  code *local_1a8;
  code *pcStack_1a0;
  undefined1 local_198 [200];
  TraceStats local_d0;
  
  protos::gen::TraceStats::TraceStats(&local_d0);
  uVar2 = this->tracing_session_id_;
  if (uVar2 == 0) {
LAB_002bb743:
    local_198[0x10] = 0;
  }
  else {
    this_01 = this->service_;
    p_Var5 = (this_01->tracing_sessions_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    if (p_Var5 == (_Base_ptr)0x0) goto LAB_002bb743;
    p_Var1 = &(this_01->tracing_sessions_)._M_t._M_impl.super__Rb_tree_header;
    p_Var6 = &p_Var1->_M_header;
    do {
      if (*(ulong *)(p_Var5 + 1) >= uVar2) {
        p_Var6 = p_Var5;
      }
      p_Var5 = (&p_Var5->_M_left)[*(ulong *)(p_Var5 + 1) < uVar2];
    } while (p_Var5 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var6 == p_Var1) || (uVar2 < *(ulong *)(p_Var6 + 1)))
    goto LAB_002bb743;
    TracingServiceImpl::GetTraceStats
              ((TraceStats *)local_198,this_01,(TracingSession *)&p_Var6[1]._M_parent);
    protos::gen::TraceStats::operator=(&local_d0,(TraceStats *)local_198);
    protos::gen::TraceStats::~TraceStats((TraceStats *)local_198);
    local_198[0x10] = 1;
  }
  local_198._0_8_ =
       (this->weak_ptr_factory_).weak_ptr_.handle_.
       super___shared_ptr<perfetto::TracingServiceImpl::ConsumerEndpointImpl_*,_(__gnu_cxx::_Lock_policy)2>
       ._M_ptr;
  this_02 = (pointer)(this->weak_ptr_factory_).weak_ptr_.handle_.
                     super___shared_ptr<perfetto::TracingServiceImpl::ConsumerEndpointImpl_*,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi;
  if (this_02 == (pointer)0x0) {
    pTVar7 = this->task_runner_;
    local_198._8_8_ = (pointer)0x0;
  }
  else {
    local_198._8_8_ = this_02;
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)&this_02->buffer_size_ = (int)this_02->buffer_size_ + 1;
      UNLOCK();
      pTVar7 = this->task_runner_;
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&this_02->buffer_size_ = (int)this_02->buffer_size_ + 1;
        UNLOCK();
        goto LAB_002bb7a3;
      }
    }
    else {
      *(int *)&this_02->buffer_size_ = (int)this_02->buffer_size_ + 1;
      pTVar7 = this->task_runner_;
    }
    *(int *)&this_02->buffer_size_ = (int)this_02->buffer_size_ + 1;
  }
LAB_002bb7a3:
  this_00 = (TraceStats *)(local_198 + 0x18);
  protos::gen::TraceStats::TraceStats(this_00,&local_d0);
  local_1a8 = (code *)0x0;
  pcStack_1a0 = (code *)0x0;
  local_1b8 = (undefined8 *)0x0;
  uStack_1b0 = 0;
  puVar4 = (undefined8 *)operator_new(200);
  uVar3 = local_198._8_8_;
  local_198._8_8_ = (pointer)0x0;
  *puVar4 = local_198._0_8_;
  puVar4[1] = uVar3;
  local_198._0_8_ = (_func_int **)0x0;
  *(undefined1 *)(puVar4 + 2) = local_198[0x10];
  protos::gen::TraceStats::TraceStats((TraceStats *)(puVar4 + 3),this_00);
  pcStack_1a0 = std::
                _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc:59649:26)>
                ::_M_invoke;
  local_1a8 = std::
              _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/kokkos[P]kokkos-tools/profiling/perfetto-connector/perfetto/perfetto.cc:59649:26)>
              ::_M_manager;
  local_1b8 = puVar4;
  (*pTVar7->_vptr_TaskRunner[2])(pTVar7);
  if (local_1a8 != (code *)0x0) {
    (*local_1a8)(&local_1b8,&local_1b8,3);
  }
  protos::gen::TraceStats::~TraceStats(this_00);
  if ((pointer)local_198._8_8_ != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_198._8_8_);
  }
  if (this_02 != (pointer)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)this_02);
  }
  protos::gen::TraceStats::~TraceStats(&local_d0);
  return;
}

Assistant:

void TracingServiceImpl::ConsumerEndpointImpl::GetTraceStats() {
  PERFETTO_DCHECK_THREAD(thread_checker_);
  bool success = false;
  TraceStats stats;
  TracingSession* session = service_->GetTracingSession(tracing_session_id_);
  if (session) {
    success = true;
    stats = service_->GetTraceStats(session);
  }
  auto weak_this = weak_ptr_factory_.GetWeakPtr();
  task_runner_->PostTask([weak_this, success, stats] {
    if (weak_this)
      weak_this->consumer_->OnTraceStats(success, stats);
  });
}